

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentTypeImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMDocumentTypeImpl::DOMDocumentTypeImpl
          (DOMDocumentTypeImpl *this,DOMDocument *ownerDoc,XMLCh *dtName,bool heap)

{
  DOMDocument *doc_00;
  XMLCh *pXVar1;
  DOMNamedNodeMapImpl *pDVar2;
  DOMDocumentImpl *local_d0;
  DOMDocumentImpl *local_88;
  DOMNode *local_58;
  DOMDocument *doc;
  XMLMutexLock lock;
  bool heap_local;
  XMLCh *dtName_local;
  DOMDocument *ownerDoc_local;
  DOMDocumentTypeImpl *this_local;
  
  DOMDocumentType::DOMDocumentType(&this->super_DOMDocumentType);
  HasDOMNodeImpl::HasDOMNodeImpl(&this->super_HasDOMNodeImpl);
  HasDOMParentImpl::HasDOMParentImpl(&this->super_HasDOMParentImpl);
  HasDOMChildImpl::HasDOMChildImpl(&this->super_HasDOMChildImpl);
  (this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode =
       (_func_int **)&PTR__DOMDocumentTypeImpl_005299a8;
  (this->super_HasDOMNodeImpl)._vptr_HasDOMNodeImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_00529b88;
  (this->super_HasDOMParentImpl)._vptr_HasDOMParentImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_00529bb8;
  (this->super_HasDOMChildImpl)._vptr_HasDOMChildImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_00529be8;
  local_58 = (DOMNode *)0x0;
  if (ownerDoc != (DOMDocument *)0x0) {
    local_58 = &ownerDoc->super_DOMNode;
  }
  DOMNodeImpl::DOMNodeImpl(&this->fNode,(DOMNode *)this,local_58);
  DOMParentNode::DOMParentNode(&this->fParent,(DOMNode *)this,ownerDoc);
  DOMChildNode::DOMChildNode(&this->fChild);
  this->fName = (XMLCh *)0x0;
  this->fEntities = (DOMNamedNodeMapImpl *)0x0;
  this->fNotations = (DOMNamedNodeMapImpl *)0x0;
  this->fElements = (DOMNamedNodeMapImpl *)0x0;
  this->fPublicId = (XMLCh *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  this->fInternalSubset = (XMLCh *)0x0;
  this->fIntSubsetReading = false;
  this->fIsCreatedFromHeap = heap;
  if (ownerDoc == (DOMDocument *)0x0) {
    XMLMutexLock::XMLMutexLock((XMLMutexLock *)&doc,sDocumentMutex);
    doc_00 = sDocument;
    if (sDocument == (DOMDocument *)0x0) {
      local_d0 = (DOMDocumentImpl *)0x0;
    }
    else {
      local_d0 = (DOMDocumentImpl *)&sDocument[-1].super_DOMNode;
    }
    pXVar1 = DOMDocumentImpl::getPooledString(local_d0,dtName);
    this->fName = pXVar1;
    pDVar2 = (DOMNamedNodeMapImpl *)operator_new(0x618,doc_00);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar2,(DOMNode *)this);
    this->fEntities = pDVar2;
    pDVar2 = (DOMNamedNodeMapImpl *)operator_new(0x618,doc_00);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar2,(DOMNode *)this);
    this->fNotations = pDVar2;
    pDVar2 = (DOMNamedNodeMapImpl *)operator_new(0x618,doc_00);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar2,(DOMNode *)this);
    this->fElements = pDVar2;
    XMLMutexLock::~XMLMutexLock((XMLMutexLock *)&doc);
  }
  else {
    if (ownerDoc == (DOMDocument *)0x0) {
      local_88 = (DOMDocumentImpl *)0x0;
    }
    else {
      local_88 = (DOMDocumentImpl *)&ownerDoc[-1].super_DOMNode;
    }
    pXVar1 = DOMDocumentImpl::getPooledString(local_88,dtName);
    this->fName = pXVar1;
    pDVar2 = (DOMNamedNodeMapImpl *)operator_new(0x618,ownerDoc);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar2,(DOMNode *)this);
    this->fEntities = pDVar2;
    pDVar2 = (DOMNamedNodeMapImpl *)operator_new(0x618,ownerDoc);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar2,(DOMNode *)this);
    this->fNotations = pDVar2;
    pDVar2 = (DOMNamedNodeMapImpl *)operator_new(0x618,ownerDoc);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar2,(DOMNode *)this);
    this->fElements = pDVar2;
  }
  return;
}

Assistant:

DOMDocumentTypeImpl::DOMDocumentTypeImpl(DOMDocument *ownerDoc,
                                   const XMLCh *dtName,
                                   bool heap)
    : fNode(this, ownerDoc),
    fParent(this, ownerDoc),
    fName(0),
    fEntities(0),
    fNotations(0),
    fElements(0),
    fPublicId(0),
    fSystemId(0),
    fInternalSubset(0),
    fIntSubsetReading(false),
    fIsCreatedFromHeap(heap)
{
    if (ownerDoc)
    {
        fName = ((DOMDocumentImpl *)ownerDoc)->getPooledString(dtName);
        fEntities = new (ownerDoc) DOMNamedNodeMapImpl(this);
        fNotations= new (ownerDoc) DOMNamedNodeMapImpl(this);
        fElements = new (ownerDoc) DOMNamedNodeMapImpl(this);
    }
    else
    {
        XMLMutexLock lock(sDocumentMutex);
        DOMDocument* doc = sDocument;
        fName = ((DOMDocumentImpl *)doc)->getPooledString(dtName);
        fEntities = new (doc) DOMNamedNodeMapImpl(this);
        fNotations= new (doc) DOMNamedNodeMapImpl(this);
        fElements = new (doc) DOMNamedNodeMapImpl(this);
    }
}